

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardVariable.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::StandardVariable::Decode(StandardVariable *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (5 < KVar1) {
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32Type);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Length);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void StandardVariable::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < STANDARD_VARIABLE_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui32Type
           >> m_ui16Length;
}